

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O3

void testOptimized(string *tempDir)

{
  pointer pcVar1;
  long *pFilename;
  long *local_38 [2];
  long local_28 [2];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\nTesting optimized code path for rgb(a) images-- 2048x1152 (alignment respected) UNCOMPRESSED"
             ,0x5d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\tNON-OPTIMIZABLE file",0x15);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  pcVar1 = (tempDir->_M_dataplus)._M_p;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + tempDir->_M_string_length);
  std::__cxx11::string::append((char *)local_38);
  pFilename = local_38[0];
  remove((char *)local_38[0]);
  anon_unknown.dwarf_23d889::writeFile
            ((char *)pFilename,0x47f,0x7ff,IMAGE_TYPE_OTHER,false,NO_COMPRESSION);
  anon_unknown.dwarf_23d889::readValidateFile((char *)pFilename,0x47f,0x7ff,IMAGE_TYPE_OTHER,false);
  remove((char *)pFilename);
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\tALIGNED -- MONO -- NO COMPRESSION",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  anon_unknown.dwarf_23d889::testAllCombinations(true,false,NO_COMPRESSION,tempDir);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\tUNALIGNED -- MONO -- NO COMPRESSION",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  anon_unknown.dwarf_23d889::testAllCombinations(false,false,NO_COMPRESSION,tempDir);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\tALIGNED -- MONO -- ZIP COMPRESSION",0x23);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  anon_unknown.dwarf_23d889::testAllCombinations(true,false,ZIP_COMPRESSION,tempDir);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\tUNALIGNED -- MONO -- ZIP COMPRESSION",0x25);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  anon_unknown.dwarf_23d889::testAllCombinations(false,false,ZIP_COMPRESSION,tempDir);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\tALIGNED -- STEREO -- NO COMPRESSION",0x24);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  anon_unknown.dwarf_23d889::testAllCombinations(true,true,NO_COMPRESSION,tempDir);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\tUNALIGNED -- STEREO -- NO COMPRESSION",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  anon_unknown.dwarf_23d889::testAllCombinations(false,true,NO_COMPRESSION,tempDir);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\tALIGNED -- STEREO -- ZIP COMPRESSION",0x25);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  anon_unknown.dwarf_23d889::testAllCombinations(true,true,ZIP_COMPRESSION,tempDir);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\tUNALIGNED -- STEREO -- ZIP COMPRESSION",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  anon_unknown.dwarf_23d889::testAllCombinations(false,true,ZIP_COMPRESSION,tempDir);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"RGB(A) files validation complete \n",0x22);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  return;
}

Assistant:

void
testOptimized (const std::string & tempDir)
{    
    try
    {
        // Test all combinations
        // Aligned file with no compression
        // Unaligned file with no compression
        // Aligned file with zip compression 
        // Unaligned file with zip compression
        //
        // Other algorithms are not necessary because we are not testing
        // compression but whetherthe optimized readPixels() code works
        // with a compressed file.
        // MONO
        cout << "\nTesting optimized code path for rgb(a) images-- "
                "2048x1152 (alignment respected) UNCOMPRESSED" << endl;

                         
        cout << "\tNON-OPTIMIZABLE file" << endl;
        testNonOptimized(tempDir);
                
        cout << "\tALIGNED -- MONO -- NO COMPRESSION" << endl;
        testAllCombinations (true, false, NO_COMPRESSION, tempDir);

        cout << "\tUNALIGNED -- MONO -- NO COMPRESSION" << endl;
        testAllCombinations (false, false, NO_COMPRESSION, tempDir);

        cout << "\tALIGNED -- MONO -- ZIP COMPRESSION" << endl;
        testAllCombinations (true, false, ZIP_COMPRESSION, tempDir);

        cout << "\tUNALIGNED -- MONO -- ZIP COMPRESSION" << endl;
        testAllCombinations (false, false, ZIP_COMPRESSION, tempDir);


        //// STEREO
        cout << "\tALIGNED -- STEREO -- NO COMPRESSION" << endl;
        testAllCombinations (true, true, NO_COMPRESSION, tempDir);

        cout << "\tUNALIGNED -- STEREO -- NO COMPRESSION" << endl;
        testAllCombinations (false, true, NO_COMPRESSION, tempDir);

        cout << "\tALIGNED -- STEREO -- ZIP COMPRESSION" << endl;
        testAllCombinations (true, true, ZIP_COMPRESSION, tempDir);

        cout << "\tUNALIGNED -- STEREO -- ZIP COMPRESSION" << endl;
        testAllCombinations (false, true, ZIP_COMPRESSION, tempDir);

        cout << "RGB(A) files validation complete \n" << endl;
    }
    catch (const std::exception &e)
    {
	    cerr << "ERROR -- caught exception: " << e.what() << endl;
	    assert (false);
    }

}